

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O0

void fs_listdir_fileinfo(char *dir,FS_LISTDIR_CALLBACK_FILEINFO cb,int type,void *user)

{
  long lVar1;
  int iVar2;
  int iVar3;
  DIR *__dirp;
  dirent *pdVar4;
  undefined8 in_RCX;
  undefined4 in_EDX;
  code *in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  DIR *d;
  int length;
  dirent *entry;
  CFsFileInfo info;
  time_t modified;
  time_t created;
  char buffer [512];
  undefined4 in_stack_fffffffffffffd88;
  uint in_stack_fffffffffffffd8c;
  code *in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffda0;
  char *local_230;
  undefined8 local_228;
  undefined8 local_220;
  undefined8 local_218;
  undefined8 local_210;
  char local_208 [64];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_210 = 0xffffffffffffffff;
  local_218 = 0xffffffffffffffff;
  __dirp = opendir(in_RDI);
  if (__dirp != (DIR *)0x0) {
    str_format(local_208,0x200,"%s/",in_RDI);
    iVar2 = str_length((char *)0x256bd4);
    do {
      pdVar4 = readdir(__dirp);
      if (pdVar4 == (dirent *)0x0) break;
      str_copy((char *)in_stack_fffffffffffffd90,
               (char *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),0);
      fs_file_time((char *)CONCAT44(iVar2,in_stack_fffffffffffffda0),(time_t *)__dirp,
                   (time_t *)in_stack_fffffffffffffd90);
      local_230 = pdVar4->d_name;
      local_228 = local_210;
      local_220 = local_218;
      in_stack_fffffffffffffd90 = in_RSI;
      if (pdVar4->d_type == '\0') {
        in_stack_fffffffffffffd8c = fs_is_dir((char *)in_RSI);
      }
      else {
        in_stack_fffffffffffffd8c = (uint)(pdVar4->d_type == '\x04');
      }
      iVar3 = (*in_stack_fffffffffffffd90)(&local_230,in_stack_fffffffffffffd8c,in_EDX,in_RCX);
    } while (iVar3 == 0);
    closedir(__dirp);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void fs_listdir_fileinfo(const char *dir, FS_LISTDIR_CALLBACK_FILEINFO cb, int type, void *user)
{
#if defined(CONF_FAMILY_WINDOWS)
	WIN32_FIND_DATAW finddata;
	HANDLE handle;
	char buffer[IO_MAX_PATH_LENGTH];
	char buffer2[IO_MAX_PATH_LENGTH];
	WCHAR wBuffer[IO_MAX_PATH_LENGTH];
	int length;

	str_format(buffer, sizeof(buffer), "%s/*", dir);
	MultiByteToWideChar(CP_UTF8, 0, buffer, -1, wBuffer, sizeof(wBuffer) / sizeof(WCHAR));

	handle = FindFirstFileW(wBuffer, &finddata);
	if(handle == INVALID_HANDLE_VALUE)
		return;

	str_format(buffer, sizeof(buffer), "%s/", dir);
	length = str_length(buffer);

	/* add all the entries */
	do
	{
		WideCharToMultiByte(CP_UTF8, 0, finddata.cFileName, -1, buffer2, sizeof(buffer2), NULL, NULL);
		str_copy(buffer+length, buffer2, (int)sizeof(buffer)-length);

		CFsFileInfo info;
		info.m_pName = buffer2;
		info.m_TimeCreated = filetime_to_unixtime(&finddata.ftCreationTime);
		info.m_TimeModified = filetime_to_unixtime(&finddata.ftLastWriteTime);

		if(cb(&info, (finddata.dwFileAttributes & FILE_ATTRIBUTE_DIRECTORY) != 0, type, user))
			break;
	}
	while(FindNextFileW(handle, &finddata));

	FindClose(handle);
#else
	struct dirent *entry;
	time_t created = -1, modified = -1;
	char buffer[IO_MAX_PATH_LENGTH];
	int length;
	DIR *d = opendir(dir);

	if(!d)
		return;

	str_format(buffer, sizeof(buffer), "%s/", dir);
	length = str_length(buffer);

	while((entry = readdir(d)) != NULL)
	{
		CFsFileInfo info;

		str_copy(buffer+length, entry->d_name, (int)sizeof(buffer)-length);
		fs_file_time(buffer, &created, &modified);

		info.m_pName = entry->d_name;
		info.m_TimeCreated = created;
		info.m_TimeModified = modified;

		if(cb(&info, entry->d_type == DT_UNKNOWN ? fs_is_dir(buffer) : entry->d_type == DT_DIR, type, user))
			break;
	}

	/* close the directory and return */
	closedir(d);
#endif
}